

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void fieldsel(LexState *ls,expdesc *v)

{
  FuncState *fs;
  expdesc key;
  expdesc eStack_38;
  
  fs = ls->fs;
  luaK_exp2anyregup(fs,v);
  luaX_next(ls);
  checkname(ls,&eStack_38);
  luaK_indexed(fs,v,&eStack_38);
  return;
}

Assistant:

static void fieldsel(LexState *ls, expdesc *v) {
    /* fieldsel -> ['.' | ':'] NAME */
    FuncState *fs = ls->fs;
    expdesc key;
    luaK_exp2anyregup(fs, v);
    luaX_next(ls);  /* skip the dot or colon */
    checkname(ls, &key);
    luaK_indexed(fs, v, &key);
}